

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O1

void __thiscall
miniros::TransportPublisherLink::onMessageLength
          (TransportPublisherLink *this,ConnectionPtr *conn,shared_ptr<unsigned_char[]> *buffer,
          uint32_t size,bool success)

{
  uint __fd;
  Connection *this_00;
  undefined4 in_register_0000000c;
  undefined1 local_48 [16];
  undefined1 local_38 [24];
  
  if (this->retry_timer_handle_ != -1) {
    getInternalTimerManager();
    TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::remove
              ((TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>
                *)local_48._0_8_,(char *)(ulong)(uint)this->retry_timer_handle_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
    this->retry_timer_handle_ = -1;
  }
  if (success) {
    __fd = *(uint *)(buffer->super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (__fd < 0x3b9aca01) {
      local_48._8_8_ = 0;
      local_38._8_8_ =
           std::
           _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp:219:5)>
           ::_M_invoke;
      local_38._0_8_ =
           std::
           _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp:219:5)>
           ::_M_manager;
      local_48._0_8_ = this;
      Connection::read((this->connection_).
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       __fd,local_48,CONCAT44(in_register_0000000c,size));
      if ((code *)local_38._0_8_ != (code *)0x0) {
        (*(code *)local_38._0_8_)(local_48,local_48,3);
      }
    }
    else {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (onMessageLength::loc.initialized_ == false) {
        local_48._0_8_ =
             (TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent> *)
             local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"miniros.transport_publisher_link","");
        console::initializeLogLocation(&onMessageLength::loc,(string *)local_48,Error);
        if ((TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent> *)
            local_48._0_8_ !=
            (TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent> *)
            local_38) {
          operator_delete((void *)local_48._0_8_,local_38._0_8_ + 1);
        }
      }
      if (onMessageLength::loc.level_ != Error) {
        onMessageLength();
      }
      if (onMessageLength::loc.logger_enabled_ == true) {
        onMessageLength();
      }
      (*(this->super_PublisherLink)._vptr_PublisherLink[5])(this);
    }
  }
  else {
    this_00 = (this->connection_).
              super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (Connection *)0x0) {
      local_48._8_8_ = 0;
      local_38._8_8_ =
           std::
           _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp:195:9)>
           ::_M_invoke;
      local_38._0_8_ =
           std::
           _Function_handler<void_(const_std::shared_ptr<miniros::Connection>_&,_const_std::shared_ptr<unsigned_char[]>_&,_unsigned_int,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp:195:9)>
           ::_M_manager;
      local_48._0_8_ = this;
      Connection::read(this_00,4,local_48,CONCAT44(in_register_0000000c,size));
      if ((code *)local_38._0_8_ != (code *)0x0) {
        (*(code *)local_38._0_8_)(local_48,local_48,3);
      }
    }
  }
  return;
}

Assistant:

void TransportPublisherLink::onMessageLength(const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
{
  (void)conn;
  (void)size;
  if (retry_timer_handle_ != -1)
  {
    getInternalTimerManager()->remove(retry_timer_handle_);
    retry_timer_handle_ = -1;
  }

  if (!success)
  {
    if (connection_) {
      connection_->read(4,
        [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
        {
          this->onMessageLength(conn, buffer, size, success);
        });
    }
    return;
  }

  MINIROS_ASSERT(conn == connection_);
  MINIROS_ASSERT(size == 4);

  uint32_t len = *((uint32_t*)buffer.get());

  if (len > 1000000000)
  {
    MINIROS_ERROR("a message of over a gigabyte was " \
                "predicted in tcpros. that seems highly " \
                "unlikely, so I'll assume protocol " \
                "synchronization is lost.");
    drop();
    return;
  }

  connection_->read(len,
    [this](const ConnectionPtr& conn, const std::shared_ptr<uint8_t[]>& buffer, uint32_t size, bool success)
    {
      this->onMessage(conn, buffer, size, success);
    });
}